

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_find_high_bit_instruction(GLSLstd450 opcode,Impl *impl,CallInst *instruction)

{
  Value *this;
  CallInst *pCVar1;
  Id IVar2;
  uint uVar3;
  Operation *pOVar4;
  Type *pTVar5;
  Id local_9c;
  Id local_98;
  Id local_94;
  initializer_list<unsigned_int> local_90;
  Operation *local_80;
  Operation *op;
  initializer_list<unsigned_int> local_70;
  Operation *local_60;
  Operation *msb_sub_op;
  initializer_list<unsigned_int> local_50;
  Operation *local_40;
  Operation *eq_neg1_op;
  Value *pVStack_30;
  Id msb_id;
  Value *value;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  GLSLstd450 opcode_local;
  
  builder = (Builder *)instruction;
  instruction_local = (CallInst *)impl;
  impl_local._4_4_ = opcode;
  value = (Value *)Converter::Impl::builder(impl);
  pVStack_30 = LLVMBC::Instruction::getOperand((Instruction *)builder,1);
  eq_neg1_op._4_4_ =
       emit_native_bitscan(impl_local._4_4_,(Impl *)instruction_local,(Instruction *)0x0,pVStack_30)
  ;
  pCVar1 = instruction_local;
  IVar2 = spv::Builder::makeBoolType((Builder *)value);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpIEqual,IVar2);
  msb_sub_op._0_4_ = eq_neg1_op._4_4_;
  local_40 = pOVar4;
  msb_sub_op._4_4_ = spv::Builder::makeUintConstant((Builder *)value,0xffffffff,false);
  local_50._M_array = (iterator)&msb_sub_op;
  local_50._M_len = 2;
  Operation::add_ids(pOVar4,&local_50);
  Converter::Impl::add((Impl *)instruction_local,local_40,false);
  pCVar1 = instruction_local;
  pTVar5 = LLVMBC::Value::getType((Value *)builder);
  IVar2 = Converter::Impl::get_type_id((Impl *)pCVar1,pTVar5,0);
  pOVar4 = Converter::Impl::allocate((Impl *)pCVar1,OpISub,IVar2);
  this = value;
  local_60 = pOVar4;
  pTVar5 = LLVMBC::Value::getType(pVStack_30);
  uVar3 = LLVMBC::Type::getIntegerBitWidth(pTVar5);
  op._0_4_ = spv::Builder::makeUintConstant((Builder *)this,uVar3 - 1,false);
  op._4_4_ = eq_neg1_op._4_4_;
  local_70._M_array = (iterator)&op;
  local_70._M_len = 2;
  Operation::add_ids(pOVar4,&local_70);
  Converter::Impl::add((Impl *)instruction_local,local_60,false);
  pOVar4 = Converter::Impl::allocate((Impl *)instruction_local,OpSelect,(Value *)builder);
  local_9c = local_40->id;
  local_80 = pOVar4;
  local_98 = spv::Builder::makeUintConstant((Builder *)value,0xffffffff,false);
  local_94 = local_60->id;
  local_90._M_array = &local_9c;
  local_90._M_len = 3;
  Operation::add_ids(pOVar4,&local_90);
  Converter::Impl::add((Impl *)instruction_local,local_80,false);
  return true;
}

Assistant:

bool emit_find_high_bit_instruction(GLSLstd450 opcode, Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This is actually CLZ, and not FindMSB.
	auto *value = instruction->getOperand(1);
	spv::Id msb_id = emit_native_bitscan(opcode, impl, nullptr, value);

	Operation *eq_neg1_op = impl.allocate(spv::OpIEqual, builder.makeBoolType());
	{
		eq_neg1_op->add_ids({ msb_id, builder.makeUintConstant(~0u) });
		impl.add(eq_neg1_op);
	}

	Operation *msb_sub_op = impl.allocate(spv::OpISub, impl.get_type_id(instruction->getType()));
	{
		msb_sub_op->add_ids({
		    builder.makeUintConstant(value->getType()->getIntegerBitWidth() - 1),
		    msb_id
		});
		impl.add(msb_sub_op);
	}

	Operation *op = impl.allocate(spv::OpSelect, instruction);
	op->add_ids({ eq_neg1_op->id, builder.makeUintConstant(~0u), msb_sub_op->id });
	impl.add(op);
	return true;
}